

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

int __thiscall Fl_Text_Buffer::skip_lines(Fl_Text_Buffer *this,int startPos,int nLines)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  
  iVar5 = startPos;
  if (nLines != 0) {
    iVar1 = this->mGapStart;
    iVar3 = 0;
    if (startPos < iVar1) {
      pcVar4 = this->mBuf + startPos;
      iVar5 = 0;
      iVar3 = 0;
      do {
        if ((*pcVar4 == '\n') && (iVar3 = iVar3 + 1, iVar3 == nLines)) {
          return (startPos - iVar5) + 1;
        }
        pcVar4 = pcVar4 + 1;
        iVar5 = iVar5 + -1;
      } while (startPos - iVar1 != iVar5);
      startPos = startPos - iVar5;
    }
    iVar2 = this->mLength;
    iVar5 = startPos;
    if (startPos < iVar2) {
      pcVar4 = this->mBuf + (long)(this->mGapEnd - iVar1) + (long)startPos;
      do {
        startPos = startPos + 1;
        if ((*pcVar4 == '\n') && (iVar3 = iVar3 + 1, nLines <= iVar3)) {
          return startPos;
        }
        pcVar4 = pcVar4 + 1;
        iVar5 = iVar2;
      } while (startPos != iVar2);
    }
  }
  return iVar5;
}

Assistant:

int Fl_Text_Buffer::skip_lines(int startPos, int nLines)
{
  IS_UTF8_ALIGNED2(this, (startPos))
  
  if (nLines == 0)
    return startPos;
  
  int gapLen = mGapEnd - mGapStart;
  int pos = startPos;
  int lineCount = 0;
  while (pos < mGapStart) {
    if (mBuf[pos++] == '\n') {
      lineCount++;
      if (lineCount == nLines) {
        IS_UTF8_ALIGNED2(this, (pos))
	return pos;
      }
    }
  }
  while (pos < mLength) {
    if (mBuf[pos++ + gapLen] == '\n') {
      lineCount++;
      if (lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos))
	return pos;
      }
    }
  }
  IS_UTF8_ALIGNED2(this, (pos))
  return pos;
}